

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

int __thiscall TreeModel::rowCount(TreeModel *this,UModelIndex *parent)

{
  bool bVar1;
  
  if (0 < parent->c) {
    return 0;
  }
  bVar1 = UModelIndex::isValid(parent);
  if (bVar1) {
    this = (TreeModel *)&parent->i;
  }
  return (int)(this->rootItem->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>
              ._M_impl._M_node._M_size;
}

Assistant:

int TreeModel::rowCount(const UModelIndex &parent) const
{
    TreeItem *parentItem;
    if (parent.column() > 0)
        return 0;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
        parentItem = static_cast<TreeItem*>(parent.internalPointer());
    
    return parentItem->childCount();
}